

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::usda::USDAReader::Impl::Read(Impl *this,uint32_t state_flags,bool as_primspec)

{
  AsciiParser *this_00;
  bool bVar1;
  ostream *poVar2;
  string warn;
  ostringstream ss_w;
  AsciiParserOption local_203;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  local_203.allow_unknown_prim = (this->_config).allow_unknown_prims;
  local_203.allow_unknown_apiSchema = (this->_config).allow_unknown_apiSchema;
  local_203.strict_allowedToken_check = (this->_config).strict_allowedToken_check;
  StageMetaProcessor(this);
  RegisterPrimIdxAssignCallback(this);
  RegisterPrimSpecHandler(this);
  RegisterReconstructCallback<tinyusdz::Model>(this);
  RegisterReconstructCallback<tinyusdz::GPrim>(this);
  RegisterReconstructCallback<tinyusdz::Xform>(this);
  RegisterReconstructCallback<tinyusdz::GeomCube>(this);
  RegisterReconstructCallback<tinyusdz::GeomSphere>(this);
  RegisterReconstructCallback<tinyusdz::GeomCone>(this);
  RegisterReconstructCallback<tinyusdz::GeomPoints>(this);
  RegisterReconstructCallback<tinyusdz::GeomCylinder>(this);
  RegisterReconstructCallback<tinyusdz::GeomCapsule>(this);
  RegisterReconstructCallback<tinyusdz::GeomMesh>(this);
  RegisterReconstructCallback<tinyusdz::GeomSubset>(this);
  RegisterReconstructCallback<tinyusdz::GeomBasisCurves>(this);
  RegisterReconstructCallback<tinyusdz::GeomNurbsCurves>(this);
  RegisterReconstructCallback<tinyusdz::GeomCamera>(this);
  RegisterReconstructCallback<tinyusdz::Material>(this);
  RegisterReconstructCallback<tinyusdz::Shader>(this);
  RegisterReconstructCallback<tinyusdz::Scope>(this);
  RegisterReconstructCallback<tinyusdz::SphereLight>(this);
  RegisterReconstructCallback<tinyusdz::DomeLight>(this);
  RegisterReconstructCallback<tinyusdz::DiskLight>(this);
  RegisterReconstructCallback<tinyusdz::DistantLight>(this);
  RegisterReconstructCallback<tinyusdz::CylinderLight>(this);
  RegisterReconstructCallback<tinyusdz::SkelRoot>(this);
  RegisterReconstructCallback<tinyusdz::Skeleton>(this);
  RegisterReconstructCallback<tinyusdz::SkelAnimation>(this);
  RegisterReconstructCallback<tinyusdz::BlendShape>(this);
  this_00 = &this->_parser;
  (this->_parser)._primspec_mode = as_primspec;
  bVar1 = ascii::AsciiParser::Parse(this_00,state_flags,&local_203);
  ascii::AsciiParser::GetWarning_abi_cxx11_(&local_1e0,this_00);
  if (local_1e0._M_string_length != 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = ::std::operator<<((ostream *)local_1a0,"[warn]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"Read");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6a0);
    ::std::operator<<(poVar2," ");
    ::std::operator+(&local_200,"<USDAParser> ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0
                    );
    poVar2 = ::std::operator<<((ostream *)local_1a0,(string *)&local_200);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_warn);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  if (!bVar1) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"Read");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6a4);
    ::std::operator<<(poVar2," ");
    ascii::AsciiParser::GetError_abi_cxx11_(&local_1c0,this_00);
    ::std::operator+(&local_200,"Parse failed:\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0
                    );
    poVar2 = ::std::operator<<((ostream *)local_1a0,(string *)&local_200);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool USDAReader::Impl::Read(const uint32_t state_flags, bool as_primspec) {

  ///
  /// Convert parser option.
  ///
  ascii::AsciiParserOption ascii_parser_option;
  ascii_parser_option.allow_unknown_prim = _config.allow_unknown_prims;
  ascii_parser_option.allow_unknown_apiSchema = _config.allow_unknown_apiSchema;
  ascii_parser_option.strict_allowedToken_check = _config.strict_allowedToken_check;

  ///
  /// Setup callbacks.
  ///
  StageMetaProcessor();

  RegisterPrimIdxAssignCallback();

  // For composition(as_primspec == true)
  RegisterPrimSpecHandler();

  // For direct Prim reconstruction(load state = Toplevel)
  RegisterReconstructCallback<Model>();  // Generic prim.

  RegisterReconstructCallback<GPrim>(); // Geometric prim

  RegisterReconstructCallback<Xform>();
  RegisterReconstructCallback<GeomCube>();
  RegisterReconstructCallback<GeomSphere>();
  RegisterReconstructCallback<GeomCone>();
  RegisterReconstructCallback<GeomPoints>();
  RegisterReconstructCallback<GeomCylinder>();
  RegisterReconstructCallback<GeomCapsule>();
  RegisterReconstructCallback<GeomMesh>();
  RegisterReconstructCallback<GeomSubset>();
  RegisterReconstructCallback<GeomBasisCurves>();
  RegisterReconstructCallback<GeomNurbsCurves>();
  RegisterReconstructCallback<GeomCamera>();

  RegisterReconstructCallback<Material>();
  RegisterReconstructCallback<Shader>();

  RegisterReconstructCallback<Scope>();

  RegisterReconstructCallback<SphereLight>();
  RegisterReconstructCallback<DomeLight>();
  RegisterReconstructCallback<DiskLight>();
  RegisterReconstructCallback<DistantLight>();
  RegisterReconstructCallback<CylinderLight>();

  RegisterReconstructCallback<SkelRoot>();
  RegisterReconstructCallback<Skeleton>();
  RegisterReconstructCallback<SkelAnimation>();
  RegisterReconstructCallback<BlendShape>();

  _parser.set_primspec_mode(as_primspec);

  bool ret = _parser.Parse(state_flags, ascii_parser_option);

  std::string warn = _parser.GetWarning();
  if (!warn.empty()) {
    PUSH_WARN("<USDAParser> " + warn);
  }

  if (!ret) {
    PUSH_ERROR_AND_RETURN("Parse failed:\n" + _parser.GetError());
  }


  return true;
}